

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

vm_obj_id_t CVmObjLookupTable::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t obj_id;
  CVmObjLookupTable *this;
  size_t init_capacity;
  size_t bucket_count;
  vm_val_t src_obj;
  size_t local_48;
  size_t local_40;
  vm_val_t local_38;
  
  get_constructor_args(argc,&local_40,&local_48,&local_38);
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,0);
  this = (CVmObjLookupTable *)CVmObject::operator_new(0x10,obj_id);
  CVmObjLookupTable(this,local_40,local_48);
  populate_from_list((CVmObjLookupTable *)
                     ((long)&G_obj_table_X.pages_[obj_id >> 0xc]->ptr_ +
                     (ulong)((obj_id & 0xfff) * 0x18)),&local_38);
  sp_ = sp_ + -1;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjLookupTable::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    vm_obj_id_t id;
    size_t bucket_count;
    size_t init_capacity;
    vm_val_t src_obj;

    /* parse the arguments */
    get_constructor_args(vmg_ argc, &bucket_count, &init_capacity, &src_obj);
    
    /* 
     *   allocate the object ID - this type of construction never creates a
     *   root object 
     */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* create the object */
    new (vmg_ id) CVmObjLookupTable(vmg_ bucket_count, init_capacity);

    /* populate it with the source list if desired */
    ((CVmObjLookupTable *)vm_objp(vmg_ id))->
        populate_from_list(vmg_ &src_obj);

    /* discard the source object gc protection */
    G_stk->discard();

    /* return the new ID */
    return id;
}